

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

uint __thiscall QXmlStreamReaderPrivate::filterCarriageReturn(QXmlStreamReaderPrivate *this)

{
  uint uVar1;
  qsizetype qVar2;
  QXmlStreamReaderPrivate *in_RDI;
  uint peekc;
  uint in_stack_ffffffffffffffdc;
  uint local_4;
  
  uVar1 = peekChar(in_RDI);
  if (uVar1 == 10) {
    qVar2 = QXmlStreamSimpleStack<unsigned_int>::size(&in_RDI->putStack);
    if (qVar2 == 0) {
      in_RDI->readBufferPos = in_RDI->readBufferPos + 1;
    }
    else {
      QXmlStreamSimpleStack<unsigned_int>::pop((QXmlStreamSimpleStack<unsigned_int> *)in_RDI);
    }
    local_4 = 10;
  }
  else if (uVar1 == 0xffffffff) {
    putChar(in_RDI,in_stack_ffffffffffffffdc);
    local_4 = 0;
  }
  else {
    local_4 = 10;
  }
  return local_4;
}

Assistant:

inline uint QXmlStreamReaderPrivate::filterCarriageReturn()
{
    uint peekc = peekChar();
    if (peekc == '\n') {
        if (putStack.size())
            putStack.pop();
        else
            ++readBufferPos;
        return peekc;
    }
    if (peekc == StreamEOF) {
        putChar('\r');
        return 0;
    }
    return '\n';
}